

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_>::add
          (array<CInput::CJoystick,_allocator_default<CInput::CJoystick>_> *this,CJoystick *item)

{
  int new_len;
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->list_size;
  uVar1 = this->num_elements;
  if (uVar1 == uVar2) {
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = uVar1 >> 1;
    }
    alloc(this,uVar2 + uVar1);
    uVar2 = this->list_size;
    uVar1 = this->num_elements;
  }
  new_len = uVar1 + 1;
  if ((int)uVar2 <= (int)uVar1) {
    alloc(this,new_len);
  }
  this->num_elements = new_len;
  memcpy(&this->list[(long)new_len + -1].m_pInput,&item->m_pInput,0x90);
  return this->num_elements + -1;
}

Assistant:

int add(const T& item)
	{
		incsize();
		set_size(size()+1);
		list[num_elements-1] = item;
		return num_elements-1;
	}